

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::Q3BSPFileImporter::importTextureFromArchive
          (Q3BSPFileImporter *this,Q3BSPModel *model,ZipArchiveIOSystem *archive,aiScene *param_3,
          aiMaterial *pMatHelper,int textureId)

{
  pointer ppsVar1;
  sQ3BSPTexture *__s;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  aiTexture *paVar6;
  aiTexel *paVar7;
  ulong uVar8;
  size_t sVar9;
  aiString *this_00;
  aiTexture *pTexture;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  supportedExtensions;
  string textureName;
  string ext;
  aiString local_438;
  long *plVar5;
  
  if (((textureId < 0 || (pMatHelper == (aiMaterial *)0x0 || archive == (ZipArchiveIOSystem *)0x0))
      || (ppsVar1 = (model->m_Textures).
                    super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (int)((ulong)((long)(model->m_Textures).
                             super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar1) >> 3) <=
         textureId)) || (__s = ppsVar1[(uint)textureId], __s == (sQ3BSPTexture *)0x0)) {
    bVar2 = false;
  }
  else {
    supportedExtensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    supportedExtensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    supportedExtensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,".jpg",(allocator<char> *)&textureName);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &supportedExtensions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,".png",(allocator<char> *)&textureName);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &supportedExtensions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,".tga",(allocator<char> *)&textureName);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &supportedExtensions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    textureName._M_dataplus._M_p = (pointer)&textureName.field_2;
    textureName._M_string_length = 0;
    textureName.field_2._M_local_buf[0] = '\0';
    ext._M_dataplus._M_p = (pointer)&ext.field_2;
    ext._M_string_length = 0;
    ext.field_2._M_local_buf[0] = '\0';
    this_00 = &local_438;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,__s->strName,(allocator<char> *)&pTexture);
    bVar2 = expandFile((Q3BSPFileImporter *)this_00,archive,(string *)&local_438,
                       &supportedExtensions,&textureName,&ext);
    std::__cxx11::string::~string((string *)&local_438);
    if (bVar2) {
      iVar3 = (*(archive->super_IOSystem)._vptr_IOSystem[4])
                        (archive,textureName._M_dataplus._M_p,"rb");
      plVar5 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar5 == (long *)0x0) {
        local_438.length = 0;
        strncpy(local_438.data,__s->strName,0x400);
        sVar9 = strlen(local_438.data);
        local_438.length = (ai_uint32)sVar9;
        aiMaterial::AddProperty(pMatHelper,&local_438,"$tex.file",1,0);
      }
      else {
        uVar4 = (**(code **)(*plVar5 + 0x30))(plVar5);
        paVar6 = (aiTexture *)operator_new(0x428);
        paVar6->pcData = (aiTexel *)0x0;
        (paVar6->mFilename).length = 0;
        (paVar6->mFilename).data[0] = '\0';
        memset((paVar6->mFilename).data + 1,0x1b,0x3ff);
        paVar6->achFormatHint[0] = '\0';
        paVar6->achFormatHint[1] = '\0';
        paVar6->achFormatHint[2] = '\0';
        paVar6->achFormatHint[3] = '\0';
        paVar6->mHeight = 0;
        paVar6->mWidth = uVar4;
        pTexture = paVar6;
        paVar7 = (aiTexel *)operator_new__((ulong)uVar4);
        uVar8 = (**(code **)(*plVar5 + 0x10))(plVar5,paVar7,1,(ulong)uVar4);
        if (uVar8 != paVar6->mWidth) {
          __assert_fail("readSize == pTexture->mWidth",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                        ,0x256,
                        "bool Assimp::Q3BSPFileImporter::importTextureFromArchive(const Q3BSP::Q3BSPModel *, ZipArchiveIOSystem *, aiScene *, aiMaterial *, int)"
                       );
        }
        paVar6->pcData = paVar7;
        paVar6->achFormatHint[0] = ext._M_dataplus._M_p[1];
        paVar6->achFormatHint[1] = ext._M_dataplus._M_p[2];
        paVar6->achFormatHint[2] = ext._M_dataplus._M_p[3];
        paVar6->achFormatHint[3] = '\0';
        local_438.length = 0;
        memset(local_438.data + 1,0x1b,0x3ff);
        local_438.data[0] = '*';
        uVar4 = ASSIMP_itoa10(local_438.data + 1,0x3ff,
                              (int32_t)((ulong)((long)(this->mTextures).
                                                                                                            
                                                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(this->mTextures).
                                                                                                          
                                                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
        local_438.length = uVar4 + 1;
        (*(archive->super_IOSystem)._vptr_IOSystem[5])(archive,plVar5);
        aiMaterial::AddProperty(pMatHelper,&local_438,"$tex.file",1,0);
        std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back
                  (&this->mTextures,&pTexture);
      }
    }
    std::__cxx11::string::~string((string *)&ext);
    std::__cxx11::string::~string((string *)&textureName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&supportedExtensions);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Q3BSPFileImporter::importTextureFromArchive( const Q3BSP::Q3BSPModel *model,
                                                 ZipArchiveIOSystem *archive, aiScene*,
                                                 aiMaterial *pMatHelper, int textureId ) {
    if (nullptr == archive || nullptr == pMatHelper ) {
        return false;
    }

    if ( textureId < 0 || textureId >= static_cast<int>( model->m_Textures.size() ) ) {
        return false;
    }

    bool res = true;
    sQ3BSPTexture *pTexture = model->m_Textures[ textureId ];
    if ( !pTexture ) {
        return false;
    }

    std::vector<std::string> supportedExtensions;
    supportedExtensions.push_back( ".jpg" );
    supportedExtensions.push_back( ".png" );
    supportedExtensions.push_back( ".tga" );
    std::string textureName, ext;
    if ( expandFile( archive, pTexture->strName, supportedExtensions, textureName, ext ) ) {
        IOStream *pTextureStream = archive->Open( textureName.c_str() );
        if ( pTextureStream ) {
            size_t texSize = pTextureStream->FileSize();
            aiTexture *pTexture = new aiTexture;
            pTexture->mHeight = 0;
            pTexture->mWidth = static_cast<unsigned int>(texSize);
            unsigned char *pData = new unsigned char[ pTexture->mWidth ];
            size_t readSize = pTextureStream->Read( pData, sizeof( unsigned char ), pTexture->mWidth );
            (void)readSize;
            ai_assert( readSize == pTexture->mWidth );
            pTexture->pcData = reinterpret_cast<aiTexel*>( pData );
            pTexture->achFormatHint[ 0 ] = ext[ 1 ];
            pTexture->achFormatHint[ 1 ] = ext[ 2 ];
            pTexture->achFormatHint[ 2 ] = ext[ 3 ];
            pTexture->achFormatHint[ 3 ] = '\0';
            res = true;

            aiString name;
            name.data[ 0 ] = '*';
            name.length = 1 + ASSIMP_itoa10( name.data + 1, static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(mTextures.size()) );

            archive->Close( pTextureStream );

            pMatHelper->AddProperty( &name, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
            mTextures.push_back( pTexture );
        } else {
            // If it doesn't exist in the archive, it is probably just a reference to an external file.
            // We'll leave it up to the user to figure out which extension the file has.
            aiString name;
            strncpy( name.data, pTexture->strName, sizeof name.data );
            name.length = strlen( name.data );
            pMatHelper->AddProperty( &name, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
        }
    }

    return res;
}